

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O3

void __thiscall
ClCommandLine_UnknownArgument_Test::TestBody(ClCommandLine_UnknownArgument_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  string_stream output;
  string_stream errors;
  string local_380;
  AssertHelper local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358;
  AssertHelper local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_348;
  undefined1 local_340 [24];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  string local_308 [3];
  ios_base local_298 [264];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  local_308[0]._M_dataplus._M_p = (pointer)&local_308[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"progname","");
  (anonymous_namespace)::ClCommandLine::add<char_const*>((ClCommandLine *)this,local_308,"--arg");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308[0]._M_dataplus._M_p != &local_308[0].field_2) {
    operator_delete(local_308[0]._M_dataplus._M_p,local_308[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
  std::__cxx11::ostringstream::ostringstream(local_190);
  bVar2 = anon_unknown.dwarf_26bb7::ClCommandLine::parse_command_line_options
                    (&this->super_ClCommandLine,(string_stream *)local_308,
                     (string_stream *)local_190);
  local_350.data_._0_1_ = (internal)!bVar2;
  local_348 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_360);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_380,(internal *)&local_350,
               (AssertionResult *)"this->parse_command_line_options (output, errors)","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_340 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xc3,local_380._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_340 + 0x10),(Message *)&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_340 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if (local_360.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_360.data_ + 8))();
    }
    if (local_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_348,local_348);
    }
  }
  testing::HasSubstr<char[30]>(&local_328,(StringLike<char[30]> *)"Unknown command line argument");
  paVar1 = &local_380.field_2;
  local_380._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_380,local_328.impl_.substring_._M_dataplus._M_p,
             local_328.impl_.substring_._M_dataplus._M_p +
             local_328.impl_.substring_._M_string_length);
  local_350.data_ = (AssertHelperData *)local_340;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_350,local_380._M_dataplus._M_p,
             (long)(Type *)local_380._M_string_length + local_380._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar1) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&local_360,(char *)&local_350,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"errors.str ()")
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar1) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if (local_350.data_ != (AssertHelperData *)local_340) {
    operator_delete(local_350.data_,local_340._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.impl_.substring_._M_dataplus._M_p != &local_328.impl_.substring_.field_2) {
    operator_delete(local_328.impl_.substring_._M_dataplus._M_p,
                    local_328.impl_.substring_.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_360.data_ == '\0') {
    testing::Message::Message((Message *)&local_380);
    if (local_358 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_358->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xc5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_350,(Message *)&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_380._M_dataplus._M_p + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358,local_358);
  }
  std::__cxx11::stringbuf::str();
  local_360.data_ = (AssertHelperData *)local_380._M_string_length;
  local_340._16_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_350,"output.str ().length ()","0U",(unsigned_long *)&local_360,
             (uint *)(local_340 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar1) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if (local_350.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_380);
    if (local_348 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_348->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xc6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_360,(Message *)&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_380._M_dataplus._M_p + 8))();
    }
  }
  if (local_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_348,local_348);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
  std::ios_base::~ios_base(local_298);
  return;
}

Assistant:

TEST_F (ClCommandLine, UnknownArgument) {
    this->add ("progname", "--arg");

    string_stream output;
    string_stream errors;
    EXPECT_FALSE (this->parse_command_line_options (output, errors));
    EXPECT_THAT (errors.str (),
                 testing::HasSubstr (PSTORE_NATIVE_TEXT ("Unknown command line argument")));
    EXPECT_EQ (output.str ().length (), 0U);
}